

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageHsv.cpp
# Opt level: O0

void __thiscall AlgorithmAreaAverageHsv::Iterate(AlgorithmAreaAverageHsv *this)

{
  int iVar1;
  int iVar2;
  QRgb a_00;
  QRgb a_01;
  QRgb b_00;
  QRgb b_01;
  QRgb index_or_rgb;
  QRgb index_or_rgb_00;
  QRgb a_02;
  QRgb a_03;
  int iVar3;
  int iVar4;
  int bSwappedDifference;
  int aSwappedDifference;
  int bDifference;
  int aDifference;
  QRgb swappedHsvB;
  QRgb swappedHsvA;
  QRgb b;
  QRgb a;
  QRgb targetB;
  QRgb targetA;
  QRgb hsvB;
  QRgb hsvA;
  int areaSize;
  QPoint bLoc;
  QPoint aLoc;
  int i;
  int repeats;
  AlgorithmAreaAverageHsv *this_local;
  
  for (aLoc.xp = 0; aLoc.xp < 100000; aLoc.xp = aLoc.xp + 1) {
    iVar1 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    iVar2 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    QPoint::QPoint(&bLoc,iVar1,iVar2);
    iVar1 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    iVar2 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    QPoint::QPoint((QPoint *)&hsvA,iVar1,iVar2);
    a_00 = GetAverageColourInArea(this,&(this->super_AlgorithmBase).allRgb_,&bLoc,3);
    a_01 = GetAverageColourInArea(this,&(this->super_AlgorithmBase).allRgb_,(QPoint *)&hsvA,3);
    b_00 = GetAverageColourInArea(this,&(this->super_AlgorithmBase).target_,&bLoc,3);
    b_01 = GetAverageColourInArea(this,&(this->super_AlgorithmBase).target_,(QPoint *)&hsvA,3);
    index_or_rgb = QImage::pixel(&(this->super_AlgorithmBase).allRgb_,&bLoc);
    index_or_rgb_00 = QImage::pixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&hsvA);
    QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,&bLoc,index_or_rgb_00);
    QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&hsvA,index_or_rgb);
    a_02 = GetAverageColourInArea(this,&(this->super_AlgorithmBase).allRgb_,&bLoc,3);
    a_03 = GetAverageColourInArea(this,&(this->super_AlgorithmBase).allRgb_,(QPoint *)&hsvA,3);
    iVar1 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_00,b_00);
    iVar2 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_01,b_01);
    iVar3 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_02,b_00);
    iVar4 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_03,b_01);
    if (iVar3 + iVar4 < iVar1 + iVar2) {
      (this->super_AlgorithmBase).improvements_ = (this->super_AlgorithmBase).improvements_ + 1;
    }
    else {
      QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,&bLoc,index_or_rgb);
      QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&hsvA,index_or_rgb_00);
    }
  }
  (this->super_AlgorithmBase).iterations_ = (this->super_AlgorithmBase).iterations_ + 100000;
  AlgorithmBase::onIterationsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).iterations_);
  AlgorithmBase::onImprovementsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).improvements_);
  return;
}

Assistant:

void AlgorithmAreaAverageHsv::Iterate()
{
    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;
    for (int i = 0; i < repeats; ++i) {
        QPoint aLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QPoint bLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        const int areaSize = 3;
        QRgb hsvA = GetAverageColourInArea(allRgb_, aLoc, areaSize);
        QRgb hsvB = GetAverageColourInArea(allRgb_, bLoc, areaSize);
        QRgb targetA = GetAverageColourInArea(target_, aLoc, areaSize);
        QRgb targetB = GetAverageColourInArea(target_, bLoc, areaSize);

        QRgb a = allRgb_.pixel(aLoc);
        QRgb b = allRgb_.pixel(bLoc);
        allRgb_.setPixel(aLoc, b);
        allRgb_.setPixel(bLoc, a);
        QRgb swappedHsvA = GetAverageColourInArea(allRgb_, aLoc, areaSize);
        QRgb swappedHsvB = GetAverageColourInArea(allRgb_, bLoc, areaSize);

        int aDifference = ColourDifference(hsvA, targetA);
        int bDifference = ColourDifference(hsvB, targetB);

        int aSwappedDifference = ColourDifference(swappedHsvA, targetA);
        int bSwappedDifference = ColourDifference(swappedHsvB, targetB);

       if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
           // Already swapped the pixels!
           ++improvements_;
       } else {
           // Swap back if we need to
           allRgb_.setPixel(aLoc, a);
           allRgb_.setPixel(bLoc, b);
       }
    }
    iterations_ += repeats;

    emit onIterationsChanged(iterations_);
    emit onImprovementsChanged(improvements_);
}